

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_stack.cpp
# Opt level: O2

bool test3(void)

{
  int iVar1;
  int local_3c;
  _Vector_base<int,_std::allocator<int>_> local_38;
  
  for (iVar1 = 0; iVar1 != 0x14; iVar1 = iVar1 + 1) {
    local_38._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_38._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_38._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    for (local_3c = 0; local_3c < 1000000; local_3c = local_3c + 1) {
      std::vector<int,_std::allocator<int>_>::push_back
                ((vector<int,_std::allocator<int>_> *)&local_38,&local_3c);
    }
    local_38._M_impl.super__Vector_impl_data._M_finish =
         local_38._M_impl.super__Vector_impl_data._M_finish + -1000000;
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_38);
  }
  return true;
}

Assistant:

bool test3() {
  int nRun = 20;
  int nData = 1000000;
  for (int i = 0;i < nRun;i++) {
    Stack s;
    for (int j = 0;j < nData;j++) {
      s.push(j);
    }
    for (int j = 0;j < nData;j++) {
      s.pop();
    }
  }
  return true;
}